

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_cache.cc
# Opt level: O0

shared_ptr<StorageClient> __thiscall
StorageCache::CreateClient(StorageCache *this,DatanodeInfo *dn_info)

{
  int iVar1;
  DatanodeInfo *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<StorageClient> sVar3;
  shared_ptr<NarpcStorageClient> *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  
  iVar1 = DatanodeInfo::storage_class(in_RDX);
  if (iVar1 == 0) {
    DatanodeInfo::addr(in_RDX);
    DatanodeInfo::port(in_RDX);
    std::make_shared<NarpcStorageClient,int,int>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::shared_ptr<StorageClient>::shared_ptr<NarpcStorageClient,void>
              ((shared_ptr<StorageClient> *)in_RDX,in_stack_ffffffffffffff98);
    std::shared_ptr<NarpcStorageClient>::~shared_ptr((shared_ptr<NarpcStorageClient> *)0x170f90);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    DatanodeInfo::addr(in_RDX);
    DatanodeInfo::port(in_RDX);
    std::make_shared<NarpcStorageClient,int,int>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::shared_ptr<StorageClient>::shared_ptr<NarpcStorageClient,void>
              ((shared_ptr<StorageClient> *)in_RDX,in_stack_ffffffffffffff98);
    std::shared_ptr<NarpcStorageClient>::~shared_ptr((shared_ptr<NarpcStorageClient> *)0x170fdb);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<StorageClient>)
         sVar3.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<StorageClient> StorageCache::CreateClient(DatanodeInfo dn_info) {
  if (dn_info.storage_class() == 0) {
    return make_shared<NarpcStorageClient>(dn_info.addr(), dn_info.port());
  } else {
    return make_shared<NarpcStorageClient>(dn_info.addr(), dn_info.port());
  }
}